

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O1

container_t *
convert_to_bitset_or_array_container(run_container_t *rc,int32_t card,uint8_t *resulttype)

{
  ushort uVar1;
  uint16_t uVar2;
  int iVar3;
  rle16_t *prVar4;
  uint16_t *puVar5;
  uint16_t *puVar6;
  ulong uVar7;
  array_container_t *paVar8;
  int32_t iVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ushort uVar13;
  uint8_t uVar14;
  long lVar15;
  uint uVar16;
  
  if (card < 0x1001) {
    paVar8 = array_container_create_given_capacity(card);
    paVar8->cardinality = 0;
    iVar3 = rc->n_runs;
    uVar14 = '\x02';
    if (0 < (long)iVar3) {
      prVar4 = rc->runs;
      puVar5 = paVar8->array;
      iVar9 = paVar8->cardinality;
      lVar12 = 0;
      do {
        uVar1 = prVar4[lVar12].value;
        uVar2 = prVar4[lVar12].length;
        uVar13 = uVar2 + uVar1;
        if (uVar1 < uVar13) {
          puVar6 = paVar8->array;
          lVar15 = 0;
          do {
            puVar6[iVar9 + lVar15] = uVar1 + (short)lVar15;
            lVar15 = lVar15 + 1;
          } while (uVar2 != (uint16_t)lVar15);
          iVar9 = iVar9 + (int)lVar15;
        }
        lVar15 = (long)iVar9;
        iVar9 = iVar9 + 1;
        puVar5[lVar15] = uVar13;
        lVar12 = lVar12 + 1;
      } while (lVar12 != iVar3);
      paVar8->cardinality = iVar9;
    }
  }
  else {
    paVar8 = (array_container_t *)bitset_container_create();
    iVar3 = rc->n_runs;
    if (0 < (long)iVar3) {
      prVar4 = rc->runs;
      puVar5 = paVar8->array;
      lVar12 = 0;
      do {
        uVar1 = prVar4[lVar12].value;
        uVar13 = prVar4[lVar12].length;
        uVar16 = (uint)uVar13 + (uint)uVar1;
        uVar10 = (uint)(uVar1 >> 6);
        uVar11 = uVar16 >> 6;
        if (uVar11 - uVar10 == 0) {
          *(ulong *)(puVar5 + (ulong)uVar10 * 4) =
               *(ulong *)(puVar5 + (ulong)uVar10 * 4) |
               (0xffffffffffffffffU >> (0x3fU - (char)uVar13 & 0x3f)) << ((byte)uVar1 & 0x3f);
        }
        else {
          uVar7 = *(ulong *)(puVar5 + (ulong)uVar11 * 4);
          *(ulong *)(puVar5 + (ulong)uVar10 * 4) =
               *(ulong *)(puVar5 + (ulong)uVar10 * 4) | -1L << ((byte)uVar1 & 0x3f);
          if (uVar10 + 1 < uVar11) {
            memset(puVar5 + (ulong)(uVar1 >> 6) * 4 + 4,0xff,
                   (ulong)((uVar11 - uVar10) - 2 >> 1) * 0x10 + 0x10);
          }
          *(ulong *)(puVar5 + (ulong)uVar11 * 4) =
               uVar7 | 0xffffffffffffffffU >> (~(byte)uVar16 & 0x3f);
        }
        lVar12 = lVar12 + 1;
      } while (iVar3 != lVar12);
    }
    paVar8->cardinality = card;
    uVar14 = '\x01';
  }
  *resulttype = uVar14;
  return paVar8;
}

Assistant:

container_t *convert_to_bitset_or_array_container(run_container_t *rc,
                                                  int32_t card,
                                                  uint8_t *resulttype) {
    if (card <= DEFAULT_MAX_SIZE) {
        array_container_t *answer = array_container_create_given_capacity(card);
        answer->cardinality = 0;
        for (int rlepos = 0; rlepos < rc->n_runs; ++rlepos) {
            uint16_t run_start = rc->runs[rlepos].value;
            uint16_t run_end = run_start + rc->runs[rlepos].length;
            for (uint16_t run_value = run_start; run_value < run_end;
                 ++run_value) {
                answer->array[answer->cardinality++] = run_value;
            }
            answer->array[answer->cardinality++] = run_end;
        }
        assert(card == answer->cardinality);
        *resulttype = ARRAY_CONTAINER_TYPE;
        // run_container_free(r);
        return answer;
    }
    bitset_container_t *answer = bitset_container_create();
    for (int rlepos = 0; rlepos < rc->n_runs; ++rlepos) {
        uint16_t run_start = rc->runs[rlepos].value;
        bitset_set_lenrange(answer->words, run_start, rc->runs[rlepos].length);
    }
    answer->cardinality = card;
    *resulttype = BITSET_CONTAINER_TYPE;
    // run_container_free(r);
    return answer;
}